

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderState.hpp
# Opt level: O1

void __thiscall rr::FragmentOperationState::FragmentOperationState(FragmentOperationState *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  this->scissorTestEnabled = false;
  (this->scissorRectangle).left = 0;
  (this->scissorRectangle).bottom = 0;
  (this->scissorRectangle).width = 1;
  (this->scissorRectangle).height = 1;
  this->stencilTestEnabled = false;
  do {
    puVar1 = (undefined8 *)((long)&this->stencilStates[0].func + lVar2);
    *puVar1 = 1;
    puVar1[1] = 0xffffffff;
    *(undefined8 *)((long)&this->stencilStates[0].dpFail + lVar2) = 0;
    *(undefined4 *)((long)&this->stencilStates[0].writeMask + lVar2) = 0xffffffff;
    lVar2 = lVar2 + 0x1c;
  } while (lVar2 != 0x38);
  this->depthTestEnabled = false;
  this->depthFunc = TESTFUNC_LESS;
  this->depthMask = true;
  this->blendMode = BLENDMODE_NONE;
  (this->blendRGBState).equation = BLENDEQUATION_ADD;
  (this->blendRGBState).srcFunc = BLENDFUNC_ONE;
  (this->blendRGBState).dstFunc = BLENDFUNC_ZERO;
  (this->blendAState).equation = BLENDEQUATION_ADD;
  (this->blendAState).srcFunc = BLENDFUNC_ONE;
  *(undefined8 *)&(this->blendAState).dstFunc = 0;
  (this->blendColor).m_data[1] = 0.0;
  (this->blendColor).m_data[2] = 0.0;
  *(undefined8 *)((this->blendColor).m_data + 3) = 0xf00000000;
  this->sRGBEnabled = true;
  this->depthClampEnabled = false;
  this->polygonOffsetEnabled = false;
  this->polygonOffsetFactor = 0.0;
  this->polygonOffsetUnits = 0.0;
  this->colorMask = (bool  [4])0x1010101;
  this->numStencilBits = 8;
  return;
}

Assistant:

FragmentOperationState (void)
		: scissorTestEnabled	(false)
		, scissorRectangle		(0, 0, 1, 1)

		, stencilTestEnabled	(false)
		// \note stencilStates[] members get default-constructed.

		, depthTestEnabled		(false)
		, depthFunc				(TESTFUNC_LESS)
		, depthMask				(true)

		, blendMode				(BLENDMODE_NONE)
		, blendRGBState			()
		, blendAState			()
		, blendColor			(0.0f)
		, blendEquationAdvaced	(BLENDEQUATION_ADVANCED_LAST)

		, sRGBEnabled			(true)

		, depthClampEnabled		(false)

		, polygonOffsetEnabled	(false)
		, polygonOffsetFactor	(0.0f)
		, polygonOffsetUnits	(0.0f)

		, colorMask				(true)

		, numStencilBits		(8)
	{
	}